

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_edison_fab_c.c
# Opt level: O3

mraa_result_t mraa_intel_edison_gpio_mode_replace(mraa_gpio_context dev,mraa_gpio_mode_t mode)

{
  int iVar1;
  mraa_result_t mVar2;
  mraa_result_t mVar3;
  mraa_gpio_context dev_00;
  char *__fmt;
  
  if (dev->value_fp != -1) {
    iVar1 = close(dev->value_fp);
    if (iVar1 != 0) {
      return MRAA_ERROR_INVALID_RESOURCE;
    }
    dev->value_fp = -1;
  }
  dev_00 = mraa_gpio_init_raw(pullup_map[dev->phy_pin]);
  mVar3 = MRAA_ERROR_INVALID_RESOURCE;
  if (dev_00 != (mraa_gpio_context)0x0) {
    mVar3 = MRAA_ERROR_FEATURE_NOT_IMPLEMENTED;
    mVar2 = mraa_gpio_dir(dev_00,MRAA_GPIO_IN);
    if (mVar2 == MRAA_SUCCESS) {
      switch(mode) {
      case MRAA_GPIO_STRONG:
      case MRAA_GPIO_HIZ:
        goto switchD_00117643_caseD_0;
      case MRAA_GPIO_PULLUP:
        break;
      case MRAA_GPIO_PULLDOWN:
        mode = MRAA_GPIO_STRONG;
        break;
      default:
        goto switchD_00117643_default;
      }
      mVar3 = mraa_gpio_dir(dev_00,MRAA_GPIO_OUT);
      if ((mVar3 == MRAA_SUCCESS) && (mVar3 = mraa_gpio_write(dev_00,mode), mVar3 == MRAA_SUCCESS))
      {
switchD_00117643_caseD_0:
        mVar3 = mraa_gpio_close(dev_00);
        return mVar3;
      }
      __fmt = "edison: Error setting pullup";
    }
    else {
      __fmt = "edison: Failed to set gpio mode-pullup";
    }
    syslog(3,__fmt);
    mraa_gpio_close(dev_00);
    mVar3 = MRAA_ERROR_INVALID_RESOURCE;
  }
switchD_00117643_default:
  return mVar3;
}

Assistant:

mraa_result_t
mraa_intel_edison_gpio_mode_replace(mraa_gpio_context dev, mraa_gpio_mode_t mode)
{
    if (dev->value_fp != -1) {
        if (close(dev->value_fp) != 0) {
            return MRAA_ERROR_INVALID_RESOURCE;
        }
        dev->value_fp = -1;
    }

    mraa_gpio_context pullup_e;
    pullup_e = mraa_gpio_init_raw(pullup_map[dev->phy_pin]);
    if (pullup_e == NULL) {
        return MRAA_ERROR_INVALID_RESOURCE;
    }
    if (mraa_gpio_dir(pullup_e, MRAA_GPIO_IN) != MRAA_SUCCESS) {
        syslog(LOG_ERR, "edison: Failed to set gpio mode-pullup");
        mraa_gpio_close(pullup_e);
        return MRAA_ERROR_INVALID_RESOURCE;
    }

    int value = -1;
    switch (mode) {
        case MRAA_GPIO_STRONG:
            break;
        case MRAA_GPIO_PULLUP:
            value = 1;
            break;
        case MRAA_GPIO_PULLDOWN:
            value = 0;
            break;
        case MRAA_GPIO_HIZ:
            break;
        default:
            return MRAA_ERROR_FEATURE_NOT_IMPLEMENTED;
    }
    if (value != -1) {
        if (mraa_gpio_dir(pullup_e, MRAA_GPIO_OUT) != MRAA_SUCCESS) {
            syslog(LOG_ERR, "edison: Error setting pullup");
            mraa_gpio_close(pullup_e);
            return MRAA_ERROR_INVALID_RESOURCE;
        }
        if (mraa_gpio_write(pullup_e, value) != MRAA_SUCCESS) {
            syslog(LOG_ERR, "edison: Error setting pullup");
            mraa_gpio_close(pullup_e);
            return MRAA_ERROR_INVALID_RESOURCE;
        }
    }

    return mraa_gpio_close(pullup_e);
}